

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

void __thiscall MT32Emu::LA32WaveGenerator::generateNextSquareWaveLogSample(LA32WaveGenerator *this)

{
  anon_enum_32 aVar1;
  Tables *pTVar2;
  Bit16u local_24;
  uint local_14;
  Bit32u logSampleValue;
  LA32WaveGenerator *this_local;
  
  aVar1 = this->phase;
  if (aVar1 == POSITIVE_RISING_SINE_SEGMENT) {
LAB_001bf102:
    pTVar2 = Tables::getInstance();
    local_14 = (uint)pTVar2->logsin9[this->squareWavePosition >> 9 & 0x1ff];
  }
  else {
    if (aVar1 == POSITIVE_LINEAR_SEGMENT) {
LAB_001bf14f:
      local_14 = 0;
      goto LAB_001bf156;
    }
    if (aVar1 != POSITIVE_FALLING_SINE_SEGMENT) {
      if (aVar1 == NEGATIVE_FALLING_SINE_SEGMENT) goto LAB_001bf102;
      if ((aVar1 == NEGATIVE_LINEAR_SEGMENT) || (aVar1 != NEGATIVE_RISING_SINE_SEGMENT))
      goto LAB_001bf14f;
    }
    pTVar2 = Tables::getInstance();
    local_14 = (uint)pTVar2->logsin9[(this->squareWavePosition >> 9 ^ 0xffffffff) & 0x1ff];
  }
LAB_001bf156:
  local_14 = (this->amp >> 10) + local_14 * 4;
  if (this->cutoffVal < 0x2000000) {
    local_14 = (0x2000000 - this->cutoffVal >> 9) + local_14;
  }
  if (local_14 < 0x10000) {
    local_24 = (Bit16u)local_14;
  }
  else {
    local_24 = 0xffff;
  }
  (this->squareLogSample).logValue = local_24;
  (this->squareLogSample).sign = (uint)(2 < (int)this->phase);
  return;
}

Assistant:

void LA32WaveGenerator::generateNextSquareWaveLogSample() {
	Bit32u logSampleValue;
	switch (phase) {
		case POSITIVE_RISING_SINE_SEGMENT:
		case NEGATIVE_FALLING_SINE_SEGMENT:
			logSampleValue = Tables::getInstance().logsin9[(squareWavePosition >> 9) & 511];
			break;
		case POSITIVE_FALLING_SINE_SEGMENT:
		case NEGATIVE_RISING_SINE_SEGMENT:
			logSampleValue = Tables::getInstance().logsin9[~(squareWavePosition >> 9) & 511];
			break;
		case POSITIVE_LINEAR_SEGMENT:
		case NEGATIVE_LINEAR_SEGMENT:
		default:
			logSampleValue = 0;
			break;
	}
	logSampleValue <<= 2;
	logSampleValue += amp >> 10;
	if (cutoffVal < MIDDLE_CUTOFF_VALUE) {
		logSampleValue += (MIDDLE_CUTOFF_VALUE - cutoffVal) >> 9;
	}

	squareLogSample.logValue = logSampleValue < 65536 ? Bit16u(logSampleValue) : 65535;
	squareLogSample.sign = phase < NEGATIVE_FALLING_SINE_SEGMENT ? LogSample::POSITIVE : LogSample::NEGATIVE;
}